

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib599.c
# Opt level: O0

int progress_callback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *clientp_local;
  
  if ((dltotal <= 0.0) || (dlnow <= dltotal)) {
    clientp_local._4_4_ = 0;
  }
  else {
    curl_mprintf(dltotal,dlnow,"%.0f > %.0f !!\n");
    clientp_local._4_4_ = -1;
  }
  return clientp_local._4_4_;
}

Assistant:

static int progress_callback(void *clientp, double dltotal,
                             double dlnow, double ultotal, double ulnow)
{
  (void)clientp;
  (void)ulnow;
  (void)ultotal;

  if((dltotal > 0.0) && (dlnow > dltotal)) {
    /* this should not happen with test case 599 */
    printf("%.0f > %.0f !!\n", dltotal, dlnow);
    return -1;
  }

  return 0;
}